

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError
EncodeImageInternal(VP8LBitWriter *bw,uint32_t *argb,VP8LHashChain *hash_chain,
                   VP8LBackwardRefs *refs_array,int width,int height,int quality,int low_effort,
                   int use_cache,CrunchConfig *config,int *cache_bits,int histogram_bits,
                   size_t init_byte_position,int *hdr_size,int *data_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  VP8LBitWriter *pVVar8;
  VP8LHistogram *nmemb;
  size_t sVar9;
  int iVar10;
  long in_RCX;
  long lVar11;
  VP8LHistogram *in_RDX;
  VP8LBitWriter *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  undefined4 in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000020;
  int *in_stack_00000028;
  uint32_t in_stack_00000030;
  int in_stack_00000038;
  int *in_stack_00000040;
  int *in_stack_00000048;
  HuffmanTreeCode *codes_1;
  HuffmanTreeCode *codes;
  int max_tokens;
  int i_1;
  int symbol_index;
  uint32_t i;
  int max_index;
  uint32_t *histogram_argb;
  int cache_bits_tmp;
  int i_cache;
  int cache_bits_best;
  CrunchSubConfig *sub_config;
  size_t bw_size_best;
  VP8LHashChain hash_chain_histogram;
  int hdr_size_tmp;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  int write_histogram_image;
  int cache_bits_init;
  int sub_configs_idx;
  uint16_t *histogram_symbols;
  HuffmanTreeCode *huffman_codes;
  HuffmanTreeToken *tokens;
  HuffmanTree *huff_tree;
  size_t bit_array_size;
  int histogram_image_size;
  VP8LHistogram *tmp_histo;
  VP8LHistogramSet *histogram_image;
  uint32_t histogram_image_xysize;
  WebPEncodingError err;
  undefined4 in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe5c;
  VP8LBitWriter *in_stack_fffffffffffffe60;
  undefined4 uVar12;
  VP8LBitWriter *bw_00;
  VP8LBitWriter *in_stack_fffffffffffffe68;
  HuffmanTreeCode *huffman_code;
  VP8LBitWriter *in_stack_fffffffffffffe80;
  VP8LBitWriter *in_stack_fffffffffffffe88;
  VP8LBitWriter *in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe98;
  int local_164;
  int local_160;
  int *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int local_144;
  int in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  uint in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  VP8LBitWriter *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  uint32_t *in_stack_fffffffffffffee8;
  VP8LBitWriter *bw_01;
  VP8LHistogramSet *in_stack_fffffffffffffef8;
  VP8LHistogram *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  VP8LBackwardRefs *in_stack_ffffffffffffff40;
  VP8LHashChain *in_stack_ffffffffffffff48;
  uint32_t *in_stack_ffffffffffffff50;
  VP8LBitWriter *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff70;
  int local_84;
  void *local_78;
  uint local_54;
  WebPEncodingError local_3c;
  
  local_3c = VP8_ENC_ERROR_OUT_OF_MEMORY;
  uVar1 = VP8LSubSampleSize(in_R8D,in_stack_00000030);
  uVar2 = VP8LSubSampleSize(in_R9D,in_stack_00000030);
  pvVar5 = WebPSafeMalloc((uint64_t)in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
  local_78 = (void *)0x0;
  pvVar6 = WebPSafeMalloc((uint64_t)in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
  memcpy(&stack0xffffffffffffff40,in_RDI,0x30);
  bw_01 = (VP8LBitWriter *)0xffffffffffffffff;
  memset(&stack0xfffffffffffffef8,0,0x10);
  if ((((pvVar5 != (void *)0x0) && (pvVar6 != (void *)0x0)) &&
      (iVar3 = VP8LHashChainInit((VP8LHashChain *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),0),
      iVar3 != 0)) &&
     (iVar3 = VP8LHashChainFill((VP8LHashChain *)in_stack_fffffffffffffef8,
                                (int)((ulong)bw_01 >> 0x20),in_stack_fffffffffffffee8,
                                in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                                in_stack_fffffffffffffedc), iVar3 != 0)) {
    if (in_stack_00000018 == 0) {
      local_160 = 0;
    }
    else if (*in_stack_00000028 == 0) {
      local_160 = 10;
    }
    else {
      local_160 = *in_stack_00000028;
    }
    iVar3 = VP8LBitWriterInit(in_stack_fffffffffffffe60,
                              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if ((iVar3 != 0) &&
       (((*(int *)(in_stack_00000020 + 0x18) < 2 && (*(int *)(in_stack_00000020 + 0xc) == 0)) ||
        (iVar3 = VP8LBitWriterClone(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60), iVar3 != 0
        )))) {
      for (local_84 = 0; local_84 < *(int *)(in_stack_00000020 + 0x18); local_84 = local_84 + 1) {
        lVar7 = in_stack_00000020 + 8 + (long)local_84 * 8;
        huffman_code = (HuffmanTreeCode *)&stack0xfffffffffffffee4;
        nmemb = in_RDX;
        local_3c = VP8LGetBackwardReferences
                             (in_stack_fffffffffffffe98,
                              (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                              (uint32_t *)in_stack_fffffffffffffe88,
                              (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                              (int)in_stack_fffffffffffffe80,(int)((ulong)huffman_code >> 0x20),
                              (int)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                              (VP8LHashChain *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (VP8LBackwardRefs *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                              (int *)in_stack_fffffffffffffed0);
        if (local_3c != VP8_ENC_OK) goto LAB_00176b0e;
        iVar3 = 0;
        while( true ) {
          iVar4 = (int)((ulong)nmemb >> 0x20);
          iVar10 = 1;
          if (*(int *)(lVar7 + 4) != 0) {
            iVar10 = 2;
          }
          if (iVar10 <= iVar3) break;
          local_164 = in_stack_fffffffffffffee4;
          if (iVar3 != 0) {
            local_164 = 0;
          }
          if ((iVar3 == 1) && (in_stack_fffffffffffffee4 == 0)) break;
          VP8LBitWriterReset((VP8LBitWriter *)&stack0xffffffffffffff40,in_RDI);
          pVVar8 = (VP8LBitWriter *)
                   VP8LAllocateHistogramSet((int)((ulong)huffman_code >> 0x20),(int)huffman_code);
          nmemb = VP8LAllocateHistogram(iVar4);
          if (((pVVar8 == (VP8LBitWriter *)0x0) || (nmemb == (VP8LHistogram *)0x0)) ||
             (bw_00 = pVVar8, iVar10 = local_164,
             iVar4 = VP8LGetHistoImageSymbols
                               (in_stack_fffffffffffffee4,iVar3,
                                (VP8LBackwardRefs *)CONCAT44(local_164,in_stack_fffffffffffffed8),
                                (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                                (int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,(int)bw_01,
                                in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                                (uint16_t *)
                                CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
             iVar4 == 0)) goto LAB_00176b0e;
          local_54 = (uint)pVVar8->bits_;
          local_78 = WebPSafeCalloc((uint64_t)nmemb,(size_t)bw_00);
          if ((local_78 == (void *)0x0) ||
             (iVar4 = GetHuffBitLengthsAndCodes
                                ((VP8LHistogramSet *)CONCAT44(in_stack_fffffffffffffee4,iVar3),
                                 (HuffmanTreeCode *)CONCAT44(iVar10,in_stack_fffffffffffffed8)),
             iVar4 == 0)) goto LAB_00176b0e;
          VP8LFreeHistogramSet((VP8LHistogramSet *)0x176661);
          VP8LFreeHistogram((VP8LHistogram *)0x17667a);
          if (iVar10 < 1) {
            VP8LPutBits(bw_00,in_stack_fffffffffffffe5c,local_164);
          }
          else {
            VP8LPutBits(bw_00,in_stack_fffffffffffffe5c,local_164);
            VP8LPutBits(bw_00,in_stack_fffffffffffffe5c,local_164);
          }
          VP8LPutBits(bw_00,in_stack_fffffffffffffe5c,local_164);
          if (1 < (int)local_54) {
            in_stack_fffffffffffffe88 =
                 (VP8LBitWriter *)WebPSafeMalloc((uint64_t)nmemb,(size_t)bw_00);
            local_54 = 0;
            if (in_stack_fffffffffffffe88 == (VP8LBitWriter *)0x0) goto LAB_00176b0e;
            for (in_stack_fffffffffffffec8 = 0; in_stack_fffffffffffffec8 < uVar1 * uVar2;
                in_stack_fffffffffffffec8 = in_stack_fffffffffffffec8 + 1) {
              in_stack_fffffffffffffec4 =
                   (uint)*(ushort *)((long)pvVar6 + (ulong)in_stack_fffffffffffffec8 * 2);
              *(uint *)((long)&in_stack_fffffffffffffe88->bits_ +
                       (ulong)in_stack_fffffffffffffec8 * 4) = in_stack_fffffffffffffec4 << 8;
              if (local_54 <= in_stack_fffffffffffffec4) {
                local_54 = in_stack_fffffffffffffec4 + 1;
              }
            }
            in_stack_fffffffffffffecc = local_54;
            VP8LPutBits(bw_00,in_stack_fffffffffffffe5c,local_164);
            uVar12 = (undefined4)((ulong)bw_00 >> 0x20);
            in_stack_fffffffffffffe90 = (VP8LBitWriter *)(in_RCX + 0x50);
            in_stack_fffffffffffffe80 = in_RDI;
            in_stack_fffffffffffffed0 = in_stack_fffffffffffffe88;
            in_stack_fffffffffffffe98 = VP8LSubSampleSize(in_R8D,in_stack_00000030);
            VP8LSubSampleSize(in_R9D,in_stack_00000030);
            bw_00 = (VP8LBitWriter *)CONCAT44(uVar12,in_stack_00000010);
            local_3c = EncodeImageNoHuffman
                                 (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                  in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                                  in_stack_ffffffffffffff70,local_160);
            WebPSafeFree((void *)0x176868);
            if (local_3c != VP8_ENC_OK) goto LAB_00176b0e;
          }
          local_144 = 0;
          for (iVar4 = 0; SBORROW4(iVar4,local_54 * 5) != (int)(iVar4 + local_54 * -5) < 0;
              iVar4 = iVar4 + 1) {
            in_stack_fffffffffffffeb0 = (int *)((long)local_78 + (long)iVar4 * 0x18);
            if (local_144 < *in_stack_fffffffffffffeb0) {
              local_144 = *in_stack_fffffffffffffeb0;
            }
          }
          pvVar5 = WebPSafeMalloc((uint64_t)nmemb,(size_t)bw_00);
          if (pvVar5 == (void *)0x0) goto LAB_00176b0e;
          for (in_stack_fffffffffffffec0 = 0;
              SBORROW4(in_stack_fffffffffffffec0,local_54 * 5) !=
              (int)(in_stack_fffffffffffffec0 + local_54 * -5) < 0;
              in_stack_fffffffffffffec0 = in_stack_fffffffffffffec0 + 1) {
            lVar11 = (long)in_stack_fffffffffffffec0;
            StoreHuffmanCode(in_stack_fffffffffffffe90,(HuffmanTree *)in_stack_fffffffffffffe88,
                             (HuffmanTreeToken *)in_stack_fffffffffffffe80,huffman_code);
            ClearHuffmanTreeIfOnlyOneSymbol((HuffmanTreeCode *)((long)local_78 + lVar11 * 0x18));
          }
          sVar9 = VP8LBitWriterNumBytes(in_RDI);
          in_stack_ffffffffffffff0c = (int)sVar9 - in_stack_00000038;
          local_3c = StoreImageToBitMask(bw_01,(int)((ulong)lVar7 >> 0x20),(int)lVar7,
                                         (VP8LBackwardRefs *)
                                         CONCAT44(in_stack_fffffffffffffee4,iVar3),
                                         (uint16_t *)CONCAT44(iVar10,in_stack_fffffffffffffed8),
                                         (HuffmanTreeCode *)in_stack_fffffffffffffed0);
          if (local_3c != VP8_ENC_OK) goto LAB_00176b0e;
          pVVar8 = (VP8LBitWriter *)VP8LBitWriterNumBytes(in_RDI);
          if (pVVar8 < bw_01) {
            bw_01 = (VP8LBitWriter *)VP8LBitWriterNumBytes(in_RDI);
            *in_stack_00000028 = iVar10;
            *in_stack_00000040 = in_stack_ffffffffffffff0c;
            sVar9 = VP8LBitWriterNumBytes(in_RDI);
            *in_stack_00000048 = ((int)sVar9 - in_stack_00000038) - *in_stack_00000040;
            VP8LBitWriterSwap(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          }
          WebPSafeFree((void *)0x176a7d);
          if (local_78 != (void *)0x0) {
            WebPSafeFree((void *)0x176aa5);
            WebPSafeFree((void *)0x176ab2);
            local_78 = (void *)0x0;
          }
          iVar3 = iVar3 + 1;
        }
      }
      VP8LBitWriterSwap(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      local_3c = VP8_ENC_OK;
    }
  }
LAB_00176b0e:
  WebPSafeFree((void *)0x176b1b);
  WebPSafeFree((void *)0x176b28);
  VP8LFreeHistogramSet((VP8LHistogramSet *)0x176b35);
  VP8LFreeHistogram((VP8LHistogram *)0x176b42);
  VP8LHashChainClear((VP8LHashChain *)0x176b4f);
  if (local_78 != (void *)0x0) {
    WebPSafeFree((void *)0x176b6b);
    WebPSafeFree((void *)0x176b78);
  }
  WebPSafeFree((void *)0x176b85);
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x176b92);
  return local_3c;
}

Assistant:

static WebPEncodingError EncodeImageInternal(
    VP8LBitWriter* const bw, const uint32_t* const argb,
    VP8LHashChain* const hash_chain, VP8LBackwardRefs refs_array[4], int width,
    int height, int quality, int low_effort, int use_cache,
    const CrunchConfig* const config, int* cache_bits, int histogram_bits,
    size_t init_byte_position, int* const hdr_size, int* const data_size) {
  WebPEncodingError err = VP8_ENC_ERROR_OUT_OF_MEMORY;
  const uint32_t histogram_image_xysize =
      VP8LSubSampleSize(width, histogram_bits) *
      VP8LSubSampleSize(height, histogram_bits);
  VP8LHistogramSet* histogram_image = NULL;
  VP8LHistogram* tmp_histo = NULL;
  int histogram_image_size = 0;
  size_t bit_array_size = 0;
  HuffmanTree* const huff_tree = (HuffmanTree*)WebPSafeMalloc(
      3ULL * CODE_LENGTH_CODES, sizeof(*huff_tree));
  HuffmanTreeToken* tokens = NULL;
  HuffmanTreeCode* huffman_codes = NULL;
  uint16_t* const histogram_symbols =
      (uint16_t*)WebPSafeMalloc(histogram_image_xysize,
                                sizeof(*histogram_symbols));
  int sub_configs_idx;
  int cache_bits_init, write_histogram_image;
  VP8LBitWriter bw_init = *bw, bw_best;
  int hdr_size_tmp;
  VP8LHashChain hash_chain_histogram;  // histogram image hash chain
  size_t bw_size_best = ~(size_t)0;
  assert(histogram_bits >= MIN_HUFFMAN_BITS);
  assert(histogram_bits <= MAX_HUFFMAN_BITS);
  assert(hdr_size != NULL);
  assert(data_size != NULL);

  // Make sure we can allocate the different objects.
  memset(&hash_chain_histogram, 0, sizeof(hash_chain_histogram));
  if (huff_tree == NULL || histogram_symbols == NULL ||
      !VP8LHashChainInit(&hash_chain_histogram, histogram_image_xysize) ||
      !VP8LHashChainFill(hash_chain, quality, argb, width, height,
                         low_effort)) {
    goto Error;
  }
  if (use_cache) {
    // If the value is different from zero, it has been set during the
    // palette analysis.
    cache_bits_init = (*cache_bits == 0) ? MAX_COLOR_CACHE_BITS : *cache_bits;
  } else {
    cache_bits_init = 0;
  }
  // If several iterations will happen, clone into bw_best.
  if (!VP8LBitWriterInit(&bw_best, 0) ||
      ((config->sub_configs_size_ > 1 ||
        config->sub_configs_[0].do_no_cache_) &&
       !VP8LBitWriterClone(bw, &bw_best))) {
    goto Error;
  }
  for (sub_configs_idx = 0; sub_configs_idx < config->sub_configs_size_;
       ++sub_configs_idx) {
    const CrunchSubConfig* const sub_config =
        &config->sub_configs_[sub_configs_idx];
    int cache_bits_best, i_cache;
    err = VP8LGetBackwardReferences(width, height, argb, quality, low_effort,
                                    sub_config->lz77_, cache_bits_init,
                                    sub_config->do_no_cache_, hash_chain,
                                    &refs_array[0], &cache_bits_best);
    if (err != VP8_ENC_OK) goto Error;

    for (i_cache = 0; i_cache < (sub_config->do_no_cache_ ? 2 : 1); ++i_cache) {
      const int cache_bits_tmp = (i_cache == 0) ? cache_bits_best : 0;
      // Speed-up: no need to study the no-cache case if it was already studied
      // in i_cache == 0.
      if (i_cache == 1 && cache_bits_best == 0) break;

      // Reset the bit writer for this iteration.
      VP8LBitWriterReset(&bw_init, bw);

      // Build histogram image and symbols from backward references.
      histogram_image =
          VP8LAllocateHistogramSet(histogram_image_xysize, cache_bits_tmp);
      tmp_histo = VP8LAllocateHistogram(cache_bits_tmp);
      if (histogram_image == NULL || tmp_histo == NULL ||
          !VP8LGetHistoImageSymbols(width, height, &refs_array[i_cache],
                                    quality, low_effort, histogram_bits,
                                    cache_bits_tmp, histogram_image, tmp_histo,
                                    histogram_symbols)) {
        goto Error;
      }
      // Create Huffman bit lengths and codes for each histogram image.
      histogram_image_size = histogram_image->size;
      bit_array_size = 5 * histogram_image_size;
      huffman_codes = (HuffmanTreeCode*)WebPSafeCalloc(bit_array_size,
                                                       sizeof(*huffman_codes));
      // Note: some histogram_image entries may point to tmp_histos[], so the
      // latter need to outlive the following call to
      // GetHuffBitLengthsAndCodes().
      if (huffman_codes == NULL ||
          !GetHuffBitLengthsAndCodes(histogram_image, huffman_codes)) {
        goto Error;
      }
      // Free combined histograms.
      VP8LFreeHistogramSet(histogram_image);
      histogram_image = NULL;

      // Free scratch histograms.
      VP8LFreeHistogram(tmp_histo);
      tmp_histo = NULL;

      // Color Cache parameters.
      if (cache_bits_tmp > 0) {
        VP8LPutBits(bw, 1, 1);
        VP8LPutBits(bw, cache_bits_tmp, 4);
      } else {
        VP8LPutBits(bw, 0, 1);
      }

      // Huffman image + meta huffman.
      write_histogram_image = (histogram_image_size > 1);
      VP8LPutBits(bw, write_histogram_image, 1);
      if (write_histogram_image) {
        uint32_t* const histogram_argb =
            (uint32_t*)WebPSafeMalloc(histogram_image_xysize,
                                      sizeof(*histogram_argb));
        int max_index = 0;
        uint32_t i;
        if (histogram_argb == NULL) goto Error;
        for (i = 0; i < histogram_image_xysize; ++i) {
          const int symbol_index = histogram_symbols[i] & 0xffff;
          histogram_argb[i] = (symbol_index << 8);
          if (symbol_index >= max_index) {
            max_index = symbol_index + 1;
          }
        }
        histogram_image_size = max_index;

        VP8LPutBits(bw, histogram_bits - 2, 3);
        err = EncodeImageNoHuffman(
            bw, histogram_argb, &hash_chain_histogram, &refs_array[2],
            VP8LSubSampleSize(width, histogram_bits),
            VP8LSubSampleSize(height, histogram_bits), quality, low_effort);
        WebPSafeFree(histogram_argb);
        if (err != VP8_ENC_OK) goto Error;
      }

      // Store Huffman codes.
      {
        int i;
        int max_tokens = 0;
        // Find maximum number of symbols for the huffman tree-set.
        for (i = 0; i < 5 * histogram_image_size; ++i) {
          HuffmanTreeCode* const codes = &huffman_codes[i];
          if (max_tokens < codes->num_symbols) {
            max_tokens = codes->num_symbols;
          }
        }
        tokens = (HuffmanTreeToken*)WebPSafeMalloc(max_tokens, sizeof(*tokens));
        if (tokens == NULL) goto Error;
        for (i = 0; i < 5 * histogram_image_size; ++i) {
          HuffmanTreeCode* const codes = &huffman_codes[i];
          StoreHuffmanCode(bw, huff_tree, tokens, codes);
          ClearHuffmanTreeIfOnlyOneSymbol(codes);
        }
      }
      // Store actual literals.
      hdr_size_tmp = (int)(VP8LBitWriterNumBytes(bw) - init_byte_position);
      err = StoreImageToBitMask(bw, width, histogram_bits, &refs_array[i_cache],
                                histogram_symbols, huffman_codes);
      if (err != VP8_ENC_OK) goto Error;
      // Keep track of the smallest image so far.
      if (VP8LBitWriterNumBytes(bw) < bw_size_best) {
        bw_size_best = VP8LBitWriterNumBytes(bw);
        *cache_bits = cache_bits_tmp;
        *hdr_size = hdr_size_tmp;
        *data_size =
            (int)(VP8LBitWriterNumBytes(bw) - init_byte_position - *hdr_size);
        VP8LBitWriterSwap(bw, &bw_best);
      }
      WebPSafeFree(tokens);
      tokens = NULL;
      if (huffman_codes != NULL) {
        WebPSafeFree(huffman_codes->codes);
        WebPSafeFree(huffman_codes);
        huffman_codes = NULL;
      }
    }
  }
  VP8LBitWriterSwap(bw, &bw_best);
  err = VP8_ENC_OK;

 Error:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(histogram_image);
  VP8LFreeHistogram(tmp_histo);
  VP8LHashChainClear(&hash_chain_histogram);
  if (huffman_codes != NULL) {
    WebPSafeFree(huffman_codes->codes);
    WebPSafeFree(huffman_codes);
  }
  WebPSafeFree(histogram_symbols);
  VP8LBitWriterWipeOut(&bw_best);
  return err;
}